

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::FormattingScene::Sampler
          (FormattingScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  int iVar1;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ParameterDictionary local_e8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_80;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_80,in_RDX);
  ParameterDictionary::ParameterDictionary(&local_e8,&local_80,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_80);
  if (this->upgrade == true) {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 == 0)) {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_108,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc
                );
      Printf<std::__cxx11::string>("%sSampler \"paddedsobol\"\n",&local_108);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 != 0) {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_108,
                   (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
        Printf<std::__cxx11::string,std::__cxx11::string_const&>
                  ("%sSampler \"%s\"\n",&local_108,name);
        goto LAB_00512160;
      }
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_108,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc
                );
      Printf<std::__cxx11::string>("%sSampler \"pmj02bn\"\n",&local_108);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p == &local_108.field_2) goto LAB_00512176;
  }
  else {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_108,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
    Printf<std::__cxx11::string,std::__cxx11::string_const&>("%sSampler \"%s\"\n",&local_108,name);
LAB_00512160:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p == &local_108.field_2) goto LAB_00512176;
  }
  operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
LAB_00512176:
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&local_108,&local_e8,*(int *)&(this->super_SceneRepresentation).field_0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_108._M_dataplus._M_p,local_108._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_e8.params);
  return;
}

Assistant:

void FormattingScene::Sampler(const std::string &name, ParsedParameterVector params,
                              FileLoc loc) {
    ParameterDictionary dict(std::move(params), RGBColorSpace::sRGB);

    if (upgrade) {
        if (name == "lowdiscrepancy" || name == "02sequence")
            Printf("%sSampler \"paddedsobol\"\n", indent());
        else if (name == "maxmindist")
            Printf("%sSampler \"pmj02bn\"\n", indent());
        else
            Printf("%sSampler \"%s\"\n", indent(), name);
    } else
        Printf("%sSampler \"%s\"\n", indent(), name);
    std::cout << dict.ToParameterList(catIndentCount);
}